

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int lj_cf_io_lines(lua_State *L)

{
  TValue *pTVar1;
  IOFileUD *pIVar2;
  TValue *pTVar3;
  ulong uVar4;
  
  pTVar3 = L->top;
  if (L->base == pTVar3) {
    L->top = pTVar3 + 1;
    pTVar3->u64 = 0xffffffffffffffff;
  }
  pTVar3 = L->base;
  if (pTVar3->u64 == 0xffffffffffffffff) {
    uVar4 = *(ulong *)((L->glref).ptr64 + 0x2c8);
  }
  else {
    pIVar2 = io_file_open(L,"r");
    pIVar2->type = 4;
    pTVar3 = L->base;
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    uVar4 = pTVar1[-1].u64 & 0x7fffffffffff;
  }
  pTVar3->u64 = uVar4 | 0xfff9800000000000;
  io_file_lines(L);
  return 1;
}

Assistant:

LJLIB_CF(io_lines)
{
  if (L->base == L->top) setnilV(L->top++);
  if (!tvisnil(L->base)) {  /* io.lines(fname) */
    IOFileUD *iof = io_file_open(L, "r");
    iof->type = IOFILE_TYPE_FILE|IOFILE_FLAG_CLOSE;
    L->top--;
    setudataV(L, L->base, udataV(L->top));
  } else {  /* io.lines() iterates over stdin. */
    setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_INPUT));
  }
  return io_file_lines(L);
}